

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O0

uint32_t __thiscall PatchNewGame::inject_func_init_game(PatchNewGame *this,ROM *rom,World *world)

{
  byte bVar1;
  uint8_t from;
  uint16_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  size_type sVar5;
  byte *pbVar6;
  allocator<char> local_129;
  string local_128;
  Param local_108 [2];
  Param local_f8 [2];
  Param local_e8 [4];
  Param local_c8 [2];
  uint16_t local_b6;
  int local_b4;
  undefined1 local_b0 [2];
  uint16_t value;
  int i;
  Code func_init_game;
  vector<unsigned_char,_std::allocator<unsigned_char>_> flag_array;
  World *world_local;
  ROM *rom_local;
  PatchNewGame *this_local;
  
  build_flag_array((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &func_init_game._labels._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
                   world);
  md::Code::Code((Code *)local_b0);
  local_b4 = 0;
  while( true ) {
    uVar4 = (ulong)local_b4;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &func_init_game._labels._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar5 <= uVar4) break;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &func_init_game._labels._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)local_b4);
    bVar1 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &func_init_game._labels._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)(local_b4 + 1));
    uVar2 = (ushort)bVar1 * 0x100 + (ushort)*pbVar6;
    local_b6 = uVar2;
    if (uVar2 != 0) {
      addr_<void>((uint32_t)local_c8,local_b4 + 0xff1000);
      md::Code::movew((Code *)local_b0,uVar2,local_c8);
    }
    local_b4 = local_b4 + 2;
  }
  uVar2 = World::spawn_map_id(world);
  addr_<void>((uint32_t)local_e8,0xff1206);
  md::Code::movew((Code *)local_b0,uVar2,local_e8);
  from = World::spawn_orientation(world);
  addr_<void>((uint32_t)local_f8,0xff5404);
  md::Code::moveb((Code *)local_b0,from,local_f8);
  uVar2 = World::starting_golds(world);
  addr_<void>((uint32_t)local_108,0xff120e);
  md::Code::movew((Code *)local_b0,uVar2,local_108);
  md::Code::rts((Code *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
  uVar3 = md::ROM::inject_code(rom,(Code *)local_b0,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  md::Code::~Code((Code *)local_b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &func_init_game._labels._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return uVar3;
}

Assistant:

[[nodiscard]] uint32_t inject_func_init_game(md::ROM& rom, const World& world) const
    {
        std::vector<uint8_t> flag_array = build_flag_array(world);

        md::Code func_init_game;
        {
            // Init all flags with the contents of flag_array
            for(int i = 0 ; i < flag_array.size() ; i += 0x2)
            {
                uint16_t value = (static_cast<uint16_t>(flag_array[i]) << 8) + static_cast<uint16_t>(flag_array[i + 1]);
                if(value)
                    func_init_game.movew(value, addr_(0xFF1000 + i));
            }

            // Set the "parent map" value to the same value as "current map" so that dialogues work on spawn map
            func_init_game.movew(world.spawn_map_id(), addr_(0xFF1206));
            // Set the orientation byte of Nigel depending on spawn location on game start
            func_init_game.moveb(world.spawn_orientation(), addr_(0xFF5404));
            // Set the appropriate starting golds
            func_init_game.movew(world.starting_golds(), addr_(0xFF120E));
        }
        func_init_game.rts();

        return rom.inject_code(func_init_game);
    }